

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O2

bool __thiscall Js::FunctionProxy::HasValidProfileEntryPoint(FunctionProxy *this)

{
  JavascriptMethod codeAddress;
  bool bVar1;
  BOOL BVar2;
  JavascriptMethod p_Var3;
  FunctionBody *this_00;
  
  codeAddress = (JavascriptMethod)((this->m_defaultEntryPointInfo).ptr)->jsMethod;
  p_Var3 = GetOriginalEntryPoint_Unchecked(this);
  if (p_Var3 == JavascriptFunction::DeferredParsingThunk) {
    bVar1 = codeAddress == ScriptContext::ProfileModeDeferredParsingThunk;
  }
  else if (p_Var3 == JavascriptFunction::DeferredDeserializeThunk) {
    bVar1 = codeAddress == ScriptContext::ProfileModeDeferredDeserializeThunk;
  }
  else {
    bVar1 = IsFunctionBody(this);
    if (bVar1) {
      this_00 = GetFunctionBody(this);
      BVar2 = FunctionBody::IsInterpreterThunk(this_00);
      if ((BVar2 != 0) || (bVar1 = FunctionBody::IsSimpleJitOriginalEntryPoint(this_00), bVar1)) {
        if (codeAddress != ScriptContext::DebugProfileProbeThunk) {
          BVar2 = IsIntermediateCodeGenThunk(codeAddress);
          return BVar2 != 0;
        }
        return true;
      }
      BVar2 = FunctionBody::IsNativeOriginalEntryPoint(this_00);
      if (BVar2 != 0) {
        return codeAddress == ScriptContext::DebugProfileProbeThunk ||
               codeAddress == DynamicProfileInfo::EnsureDynamicProfileInfoThunk;
      }
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool FunctionProxy::HasValidProfileEntryPoint() const
    {
        JavascriptMethod directEntryPoint = this->GetDefaultEntryPointInfo()->jsMethod;
        JavascriptMethod originalEntryPoint = this->GetOriginalEntryPoint_Unchecked();

        if (originalEntryPoint == DefaultDeferredParsingThunk)
        {
            return directEntryPoint == ProfileDeferredParsingThunk;
        }
        if (originalEntryPoint == DefaultDeferredDeserializeThunk)
        {
            return directEntryPoint == ProfileDeferredDeserializeThunk;
        }
        if (!this->IsFunctionBody())
        {
            return false;
        }

#if ENABLE_PROFILE_INFO
        FunctionBody * functionBody = this->GetFunctionBody();
        if (functionBody->IsInterpreterThunk() || functionBody->IsSimpleJitOriginalEntryPoint())
        {
            return directEntryPoint == ProfileEntryThunk || IsIntermediateCodeGenThunk(directEntryPoint);
        }

#if ENABLE_NATIVE_CODEGEN
        // In the profiler mode, the EnsureDynamicProfileInfoThunk is valid as we would be assigning to appropriate thunk when that thunk called.
        return functionBody->IsNativeOriginalEntryPoint() &&
            (directEntryPoint == DynamicProfileInfo::EnsureDynamicProfileInfoThunk || directEntryPoint == ProfileEntryThunk);
#endif
#else
        return true;
#endif
    }